

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  undefined4 uVar27;
  ulong uVar28;
  undefined4 uVar29;
  uint _c;
  int _c_00;
  int *piVar30;
  void *pvVar31;
  size_t sVar32;
  size_t sVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  int iVar89;
  uint uVar90;
  ulong uVar91;
  long lVar92;
  ulong uVar93;
  ulong uVar94;
  uint uVar95;
  long lVar96;
  ulong uVar97;
  float *pfVar98;
  uint _h;
  ulong uVar99;
  void *pvVar100;
  void *pvVar101;
  int iVar102;
  uint uVar103;
  long lVar104;
  long lVar105;
  undefined1 (*pauVar106) [32];
  void *pvVar107;
  ulong uVar108;
  ulong uVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  void *pvVar115;
  void *pvVar116;
  uint uVar117;
  undefined1 auVar118 [8];
  long lVar119;
  long lVar120;
  void *pvVar121;
  long lVar122;
  void *pvVar123;
  long lVar124;
  long lVar125;
  void *pvVar126;
  Mat *dst;
  int iVar127;
  long lVar128;
  long lVar129;
  _func_int ***ppp_Var130;
  uint uVar131;
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar142;
  undefined1 auVar141 [64];
  undefined1 extraout_var [56];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  float fVar150;
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar155;
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  ulong local_328;
  void *local_320;
  void *local_318;
  void *local_310;
  int tiles;
  void *local_300;
  void *local_2f8;
  long local_2f0;
  long local_2e8;
  ulong local_2d8;
  float sum0 [16];
  size_t local_288;
  long local_268;
  long local_260;
  void *local_258;
  void *local_250;
  Mat local_1f8;
  undefined1 local_1a8 [8];
  undefined4 uStack_1a0;
  float fStack_19c;
  size_t local_198;
  float local_190;
  Allocator *local_188;
  float fStack_180;
  float fStack_17c;
  undefined8 uStack_178;
  float local_170;
  size_t local_168;
  undefined1 local_158 [56];
  uint local_120;
  size_t local_118;
  undefined8 local_108;
  Mat *local_100;
  float o1 [2];
  float o0 [2];
  void *local_e8;
  int local_a8;
  int iStack_a4;
  Option opt_b;
  
  _c = bottom_blob->c;
  uVar28._0_4_ = top_blob->w;
  uVar28._4_4_ = top_blob->h;
  _c_00 = top_blob->c;
  uVar91 = (ulong)_c_00;
  piVar30 = bottom_blob->refcount;
  local_158._0_8_ = bottom_blob->data;
  local_158._8_8_ = bottom_blob->refcount;
  local_158._16_8_ = bottom_blob->elemsize;
  local_158._24_4_ = bottom_blob->elempack;
  local_158._32_8_ = bottom_blob->allocator;
  iVar102 = bottom_blob->h;
  iVar89 = bottom_blob->w;
  local_158._40_4_ = bottom_blob->dims;
  local_158._44_4_ = bottom_blob->w;
  local_158._48_4_ = bottom_blob->h;
  local_158._52_4_ = bottom_blob->d;
  local_118 = bottom_blob->cstep;
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + 1;
    UNLOCK();
    iVar89 = bottom_blob->w;
    iVar102 = bottom_blob->h;
  }
  auVar134 = vpcmpeqd_avx(local_158._40_16_,local_158._40_16_);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar28;
  auVar134 = vpsubd_avx(auVar139,auVar134);
  auVar139 = vpsrld_avx(auVar134,0x1f);
  auVar134 = vpaddd_avx(auVar134,auVar139);
  auVar133._8_4_ = 0xfffffffe;
  auVar133._0_8_ = 0xfffffffefffffffe;
  auVar133._12_4_ = 0xfffffffe;
  auVar139 = vpand_avx(auVar134,auVar133);
  local_108 = CONCAT44((int)((ulong)piVar30 >> 0x20),auVar139._0_4_);
  iVar127 = auVar139._0_4_ + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_reserved_1 = opt->use_reserved_1;
  opt_b.use_reserved_2 = opt->use_reserved_2;
  opt_b.use_reserved_3 = opt->use_reserved_3;
  opt_b.use_reserved_4 = opt->use_reserved_4;
  opt_b.use_reserved_5 = opt->use_reserved_5;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  fVar174 = 0.0;
  fVar132 = 0.0;
  fVar183 = 0.0;
  fVar192 = 0.0;
  fVar193 = 0.0;
  fVar194 = 0.0;
  local_120 = _c;
  local_100 = top_blob;
  copy_make_border(bottom_blob,(Mat *)local_158,0,(auVar139._4_4_ - iVar102) + 2,0,iVar127 - iVar89,
                   0,0.0,&opt_b);
  auVar134 = vpsrad_avx(auVar134,1);
  pvVar31 = _bias->data;
  local_168 = 0;
  auVar141 = ZEXT1664((undefined1  [16])0x0);
  local_1a8 = (undefined1  [8])0x0;
  uStack_1a0 = 0.0;
  fStack_19c = 0.0;
  local_198 = 0;
  local_190 = 0.0;
  local_188 = (Allocator *)0x0;
  fStack_180 = 0.0;
  fStack_17c = 0.0;
  uStack_178._0_4_ = 0;
  uStack_178._4_4_ = 0;
  local_170 = 0.0;
  uVar95 = auVar134._4_4_;
  uVar131 = auVar134._0_4_;
  _h = uVar95 * uVar131;
  Mat::create((Mat *)local_1a8,0x10,_h,_c,4,opt->workspace_allocator);
  uVar108 = (ulong)_c;
  if (0 < (int)_c) {
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar28;
    auVar141 = ZEXT1664(auVar134);
    auVar134 = vpcmpgtd_avx(auVar134,(undefined1  [16])0x0);
    auVar134 = vpmovsxdq_avx(auVar134);
    uVar90 = vmovmskpd_avx(auVar134);
    uVar103 = 1;
    if (1 < (int)uVar131) {
      uVar103 = uVar131;
    }
    uVar99 = 1;
    if (1 < (int)uVar95) {
      uVar99 = (ulong)uVar95;
    }
    lVar96 = (long)(int)local_108;
    local_328 = 0;
    do {
      if ((byte)((byte)uVar90 >> 1) != 0) {
        pvVar121 = (void *)(local_168 * local_328 * local_198 + (long)local_1a8);
        lVar119 = local_158._16_8_ * local_118 * local_328;
        iVar102 = 0;
        uVar109 = 0;
        do {
          if ((uVar90 & 1) != 0) {
            lVar104 = (long)iVar102;
            lVar124 = 0;
            pvVar100 = pvVar121;
            uVar117 = uVar103;
            do {
              pvVar101 = pvVar100;
              auVar134 = *(undefined1 (*) [16])
                          (local_158._0_8_ + lVar124 + lVar104 * 4 + lVar96 * 4 + 8 + lVar119);
              auVar133 = *(undefined1 (*) [16])
                          (local_158._0_8_ + lVar124 + lVar104 * 4 + lVar96 * 8 + 0x10 + lVar119);
              auVar135 = vsubps_avx(*(undefined1 (*) [16])
                                     (local_158._0_8_ + lVar124 + lVar104 * 4 + lVar119),auVar133);
              auVar151._0_4_ = auVar133._0_4_ + auVar134._0_4_;
              auVar151._4_4_ = auVar133._4_4_ + auVar134._4_4_;
              auVar151._8_4_ = auVar133._8_4_ + auVar134._8_4_;
              auVar151._12_4_ = auVar133._12_4_ + auVar134._12_4_;
              auVar133 = vsubps_avx(auVar133,auVar134);
              auVar134 = vsubps_avx(*(undefined1 (*) [16])
                                     (local_158._0_8_ +
                                     lVar124 + lVar104 * 4 + lVar96 * 0xc + 0x18 + lVar119),auVar134
                                   );
              auVar140 = vunpcklps_avx(auVar135,auVar151);
              auVar144 = vunpcklps_avx(auVar133,auVar134);
              auVar151 = vunpckhps_avx(auVar135,auVar151);
              auVar143 = vunpckhps_avx(auVar133,auVar134);
              auVar134 = vmovlhps_avx(auVar140,auVar144);
              auVar135 = vunpckhpd_avx(auVar140,auVar144);
              auVar133 = vmovlhps_avx(auVar151,auVar143);
              auVar151 = vunpckhpd_avx(auVar151,auVar143);
              auVar134 = vsubps_avx(auVar134,auVar133);
              auVar141 = ZEXT1664(auVar134);
              auVar143._0_4_ = auVar135._0_4_ + auVar133._0_4_;
              auVar143._4_4_ = auVar135._4_4_ + auVar133._4_4_;
              auVar143._8_4_ = auVar135._8_4_ + auVar133._8_4_;
              auVar143._12_4_ = auVar135._12_4_ + auVar133._12_4_;
              auVar133 = vsubps_avx(auVar133,auVar135);
              auVar135 = vsubps_avx(auVar151,auVar135);
              pvVar100 = (void *)((long)pvVar121 + lVar124 * 8 + 0x40);
              *(undefined1 (*) [16])((long)pvVar100 + -0x40) = auVar134;
              *(undefined1 (*) [16])((long)pvVar100 + -0x30) = auVar143;
              *(undefined1 (*) [16])((long)pvVar100 + -0x20) = auVar133;
              *(undefined1 (*) [16])((long)pvVar100 + -0x10) = auVar135;
              lVar124 = lVar124 + 8;
              uVar117 = uVar117 - 1;
            } while (uVar117 != 0);
            pvVar121 = (void *)((long)pvVar101 + 0x40);
          }
          uVar109 = uVar109 + 1;
          iVar102 = iVar102 + iVar127 * 2;
        } while (uVar109 != uVar99);
      }
      local_328 = local_328 + 1;
    } while (local_328 != uVar108);
  }
  local_1f8.cstep = 0;
  local_1f8.data = (void *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize = 0;
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)0x0;
  local_1f8.dims = 0;
  local_1f8.w = 0;
  local_1f8.h = 0;
  local_1f8.d = 0;
  local_1f8.c = 0;
  if ((int *)local_158._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_158._8_8_ == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((void *)local_158._0_8_ != (void *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  piVar30 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
  local_158._8_8_ = CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
  local_158._0_8_ = local_1f8.data;
  local_158._16_8_ = local_1f8.elemsize;
  local_158._24_4_ = local_1f8.elempack;
  local_158._32_8_ = local_1f8.allocator;
  local_158._44_4_ = local_1f8.w;
  local_158._40_4_ = local_1f8.dims;
  local_158._48_4_ = local_1f8.h;
  local_158._52_4_ = local_1f8.d;
  local_120 = local_1f8.c;
  local_118 = local_1f8.cstep;
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1f8.cstep = 0;
  local_1f8.data = (Allocator *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)local_1f8.data;
  local_1f8.dims = (int)local_1f8.refcount;
  local_1f8.w = local_1f8.refcount._4_4_;
  local_1f8._48_8_ = local_1f8.elemsize;
  local_1f8.c = local_1f8.elempack;
  Mat::create(&local_1f8,0x10,_h,_c_00,4,opt->workspace_allocator);
  dst = local_100;
  uVar99 = uVar91 & 0xfffffffffffffffc;
  if (0 < _c_00 >> 2) {
    local_260 = 2;
    local_2e8 = 1;
    local_268 = 0;
    local_2d8 = 0;
    do {
      if (0 < (int)_h) {
        lVar96 = local_1f8.cstep * local_1f8.elemsize;
        lVar128 = local_2d8 * 4 * lVar96;
        lVar124 = (local_2d8 * 4 + 1) * lVar96;
        lVar110 = (local_2d8 * 4 + 2) * lVar96;
        lVar96 = (local_2d8 * 4 + 3) * lVar96;
        pvVar121 = kernel_tm->data;
        sVar32 = kernel_tm->elemsize;
        sVar33 = kernel_tm->cstep;
        iVar102 = kernel_tm->w;
        lVar119 = sVar32 * sVar33;
        lVar114 = lVar119 * local_260;
        lVar111 = sVar32 * (long)iVar102;
        lVar104 = lVar119 * local_2e8;
        lVar125 = lVar119 * local_268;
        uVar109 = 0;
        do {
          if ((int)_c < 4) {
            uVar97 = 0;
            auVar157 = ZEXT864(0);
            fVar167 = 0.0;
            fVar168 = 0.0;
            fVar169 = 0.0;
            fVar170 = 0.0;
            fVar171 = 0.0;
            fVar172 = 0.0;
            fVar173 = 0.0;
            fVar154 = 0.0;
            fVar184 = 0.0;
            fVar185 = 0.0;
            fVar186 = 0.0;
            fVar187 = 0.0;
            fVar188 = 0.0;
            fVar189 = 0.0;
            fVar190 = 0.0;
            fVar191 = 0.0;
            auVar141 = ZEXT1664((undefined1  [16])0x0);
            auVar146 = ZEXT864(0);
            auVar149 = ZEXT864(0);
            fVar158 = 0.0;
            fVar159 = 0.0;
            fVar160 = 0.0;
            fVar161 = 0.0;
            fVar162 = 0.0;
            fVar163 = 0.0;
            fVar164 = 0.0;
            fVar166 = 0.0;
            auVar153 = ZEXT864(0);
          }
          else {
            lVar105 = (long)(int)fStack_17c * uVar109;
            lVar120 = (local_168 * 3 + lVar105) * local_198;
            lVar92 = (local_168 + lVar105) * local_198;
            lVar129 = (lVar105 + local_168 * 2) * local_198;
            auVar153 = ZEXT864(0);
            fVar158 = 0.0;
            fVar159 = 0.0;
            fVar160 = 0.0;
            fVar161 = 0.0;
            fVar162 = 0.0;
            fVar163 = 0.0;
            fVar164 = 0.0;
            fVar166 = 0.0;
            auVar149 = ZEXT864(0);
            auVar146 = ZEXT864(0);
            auVar141 = ZEXT1664((undefined1  [16])0x0);
            fVar184 = 0.0;
            fVar185 = 0.0;
            fVar186 = 0.0;
            fVar187 = 0.0;
            fVar188 = 0.0;
            fVar189 = 0.0;
            fVar190 = 0.0;
            fVar191 = 0.0;
            fVar167 = 0.0;
            fVar168 = 0.0;
            fVar169 = 0.0;
            fVar170 = 0.0;
            fVar171 = 0.0;
            fVar172 = 0.0;
            fVar173 = 0.0;
            fVar154 = 0.0;
            auVar157 = ZEXT864(0);
            uVar93 = 0;
            auVar118 = local_1a8;
            lVar122 = (long)pvVar121 + 0xe0;
            do {
              lVar113 = lVar125 + lVar122;
              pfVar98 = (float *)((long)auVar118 + lVar105 * local_198);
              fVar34 = *pfVar98;
              fVar35 = pfVar98[1];
              fVar36 = pfVar98[2];
              fVar37 = pfVar98[3];
              fVar38 = pfVar98[4];
              fVar39 = pfVar98[5];
              fVar40 = pfVar98[6];
              pfVar5 = (float *)((long)auVar118 + lVar105 * local_198 + 0x20);
              fVar175 = *pfVar5;
              fVar176 = pfVar5[1];
              fVar177 = pfVar5[2];
              fVar178 = pfVar5[3];
              fVar179 = pfVar5[4];
              fVar180 = pfVar5[5];
              fVar181 = pfVar5[6];
              lVar112 = lVar119 + lVar113 + -0xe0;
              lVar1 = lVar112 + lVar119;
              pfVar18 = (float *)(lVar122 + -0xe0 + lVar125);
              pfVar19 = (float *)(lVar122 + -0xc0 + lVar125);
              pfVar20 = (float *)(lVar119 + -0xe0 + lVar113);
              pfVar2 = (float *)(lVar119 + lVar1);
              pfVar6 = (float *)(lVar119 + 0x20 + lVar1);
              fVar154 = auVar153._28_4_ + fVar154;
              fVar136 = fVar192 + auVar157._28_4_;
              pfVar3 = (float *)((long)auVar118 + lVar92);
              fVar41 = *pfVar3;
              fVar42 = pfVar3[1];
              fVar43 = pfVar3[2];
              fVar44 = pfVar3[3];
              fVar45 = pfVar3[4];
              fVar46 = pfVar3[5];
              fVar47 = pfVar3[6];
              pfVar7 = (float *)((long)auVar118 + lVar92 + 0x20);
              fVar48 = *pfVar7;
              fVar49 = pfVar7[1];
              fVar50 = pfVar7[2];
              fVar51 = pfVar7[3];
              fVar52 = pfVar7[4];
              fVar53 = pfVar7[5];
              fVar54 = pfVar7[6];
              pfVar21 = (float *)(lVar122 + -0xa0 + lVar125);
              pfVar22 = (float *)(lVar122 + -0xa0 + lVar104);
              fVar150 = fVar193 + auVar149._28_4_;
              pfVar8 = (float *)(lVar122 + -0x80 + lVar104);
              fVar147 = fVar193 + auVar146._28_4_;
              pfVar23 = (float *)(lVar122 + -0xa0 + lVar114);
              pfVar9 = (float *)(lVar122 + -0x80 + lVar114);
              fVar137 = fVar193 + auVar141._28_4_;
              pfVar4 = (float *)((long)auVar118 + lVar129);
              fVar76 = *pfVar4;
              fVar77 = pfVar4[1];
              fVar78 = pfVar4[2];
              fVar79 = pfVar4[3];
              fVar80 = pfVar4[4];
              fVar81 = pfVar4[5];
              fVar82 = pfVar4[6];
              fVar193 = pfVar4[7];
              pfVar10 = (float *)(lVar122 + -0x60 + lVar125);
              fVar191 = fVar191 + fVar194;
              fVar138 = fVar192 + fVar137;
              pfVar11 = (float *)(lVar122 + -0x80 + lVar125);
              fVar142 = fVar132 + auVar153._28_4_ + fVar138;
              pfVar4 = (float *)((long)auVar118 + lVar129 + 0x20);
              fVar55 = *pfVar4;
              fVar56 = pfVar4[1];
              fVar57 = pfVar4[2];
              fVar58 = pfVar4[3];
              fVar59 = pfVar4[4];
              fVar60 = pfVar4[5];
              fVar61 = pfVar4[6];
              pfVar12 = (float *)(lVar122 + -0x40 + lVar125);
              fVar192 = fVar192 + fVar194;
              fVar183 = fVar183 + fVar166 + fVar192;
              pfVar24 = (float *)(lVar119 + -0xc0 + lVar113);
              pfVar13 = (float *)(lVar122 + -0x60 + lVar104);
              pfVar14 = (float *)(lVar122 + -0x40 + lVar104);
              fVar194 = fVar194 + fVar166;
              fVar138 = fVar192 + fVar138;
              pfVar4 = (float *)(lVar119 + lVar112);
              pfVar15 = (float *)(lVar119 + 0x20 + lVar112);
              pfVar16 = (float *)(lVar122 + -0x60 + lVar114);
              fVar182 = pfVar5[7] + fVar166;
              pfVar5 = (float *)(lVar122 + -0x40 + lVar114);
              fVar174 = pfVar98[7] + fVar166;
              pfVar17 = (float *)(lVar119 + 0x40 + lVar1);
              pfVar25 = (float *)(lVar119 + 0x80 + lVar1);
              fVar165 = fVar166 + pfVar3[7];
              pfVar3 = (float *)(lVar119 + 0x60 + lVar1);
              pfVar26 = (float *)(lVar119 + 0xa0 + lVar1);
              fVar155 = pfVar7[7] + fVar154;
              pfVar98 = (float *)((long)auVar118 + lVar120);
              fVar62 = *pfVar98;
              fVar63 = pfVar98[1];
              fVar64 = pfVar98[2];
              fVar65 = pfVar98[3];
              fVar66 = pfVar98[4];
              fVar67 = pfVar98[5];
              fVar68 = pfVar98[6];
              fVar132 = pfVar98[7];
              pfVar98 = (float *)((long)auVar118 + lVar120 + 0x20);
              fVar69 = *pfVar98;
              fVar70 = pfVar98[1];
              fVar71 = pfVar98[2];
              fVar72 = pfVar98[3];
              fVar73 = pfVar98[4];
              fVar74 = pfVar98[5];
              fVar75 = pfVar98[6];
              fVar192 = pfVar98[7];
              pfVar98 = (float *)(lVar122 + -0x20 + lVar125);
              auVar153 = ZEXT3264(CONCAT428(fVar142 + fVar155,
                                            CONCAT424(fVar40 * pfVar18[6] + auVar153._24_4_ +
                                                      fVar47 * pfVar21[6] + fVar82 * pfVar10[6] +
                                                      fVar68 * pfVar98[6],
                                                      CONCAT420(fVar39 * pfVar18[5] +
                                                                auVar153._20_4_ +
                                                                fVar46 * pfVar21[5] +
                                                                fVar81 * pfVar10[5] +
                                                                fVar67 * pfVar98[5],
                                                                CONCAT416(fVar38 * pfVar18[4] +
                                                                          auVar153._16_4_ +
                                                                          fVar45 * pfVar21[4] +
                                                                          fVar80 * pfVar10[4] +
                                                                          fVar66 * pfVar98[4],
                                                                          CONCAT412(fVar37 * pfVar18
                                                  [3] + auVar153._12_4_ +
                                                  fVar44 * pfVar21[3] + fVar79 * pfVar10[3] +
                                                  fVar65 * pfVar98[3],
                                                  CONCAT48(fVar36 * pfVar18[2] + auVar153._8_4_ +
                                                           fVar43 * pfVar21[2] + fVar78 * pfVar10[2]
                                                           + fVar64 * pfVar98[2],
                                                           CONCAT44(fVar35 * pfVar18[1] +
                                                                    auVar153._4_4_ +
                                                                    fVar42 * pfVar21[1] +
                                                                    fVar77 * pfVar10[1] +
                                                                    fVar63 * pfVar98[1],
                                                                    fVar34 * *pfVar18 +
                                                                    auVar153._0_4_ +
                                                                    fVar41 * *pfVar21 +
                                                                    fVar76 * *pfVar10 +
                                                                    fVar62 * *pfVar98))))))));
              pfVar98 = (float *)(lVar122 + lVar125);
              fVar158 = fVar175 * *pfVar19 + fVar158 + fVar48 * *pfVar11 + fVar55 * *pfVar12 +
                        fVar69 * *pfVar98;
              fVar159 = fVar176 * pfVar19[1] + fVar159 + fVar49 * pfVar11[1] + fVar56 * pfVar12[1] +
                        fVar70 * pfVar98[1];
              fVar160 = fVar177 * pfVar19[2] + fVar160 + fVar50 * pfVar11[2] + fVar57 * pfVar12[2] +
                        fVar71 * pfVar98[2];
              fVar161 = fVar178 * pfVar19[3] + fVar161 + fVar51 * pfVar11[3] + fVar58 * pfVar12[3] +
                        fVar72 * pfVar98[3];
              fVar162 = fVar179 * pfVar19[4] + fVar162 + fVar52 * pfVar11[4] + fVar59 * pfVar12[4] +
                        fVar73 * pfVar98[4];
              fVar163 = fVar180 * pfVar19[5] + fVar163 + fVar53 * pfVar11[5] + fVar60 * pfVar12[5] +
                        fVar74 * pfVar98[5];
              fVar164 = fVar181 * pfVar19[6] + fVar164 + fVar54 * pfVar11[6] + fVar61 * pfVar12[6] +
                        fVar75 * pfVar98[6];
              fVar166 = fVar183 + fVar142;
              pfVar98 = (float *)(lVar122 + -0x20 + lVar104);
              fVar150 = fVar150 + fVar142;
              auVar149 = ZEXT3264(CONCAT428(fVar194 + fVar150,
                                            CONCAT424(fVar82 * pfVar13[6] + fVar40 * pfVar20[6] +
                                                      fVar47 * pfVar22[6] + auVar149._24_4_ +
                                                      fVar68 * pfVar98[6],
                                                      CONCAT420(fVar81 * pfVar13[5] +
                                                                fVar39 * pfVar20[5] +
                                                                fVar46 * pfVar22[5] +
                                                                auVar149._20_4_ +
                                                                fVar67 * pfVar98[5],
                                                                CONCAT416(fVar80 * pfVar13[4] +
                                                                          fVar38 * pfVar20[4] +
                                                                          fVar45 * pfVar22[4] +
                                                                          auVar149._16_4_ +
                                                                          fVar66 * pfVar98[4],
                                                                          CONCAT412(fVar79 * pfVar13
                                                  [3] + fVar37 * pfVar20[3] +
                                                  fVar44 * pfVar22[3] + auVar149._12_4_ +
                                                  fVar65 * pfVar98[3],
                                                  CONCAT48(fVar78 * pfVar13[2] + fVar36 * pfVar20[2]
                                                           + fVar43 * pfVar22[2] + auVar149._8_4_ +
                                                             fVar64 * pfVar98[2],
                                                           CONCAT44(fVar77 * pfVar13[1] +
                                                                    fVar35 * pfVar20[1] +
                                                                    fVar42 * pfVar22[1] +
                                                                    auVar149._4_4_ +
                                                                    fVar63 * pfVar98[1],
                                                                    fVar76 * *pfVar13 +
                                                                    fVar34 * *pfVar20 +
                                                                    fVar41 * *pfVar22 +
                                                                    auVar149._0_4_ +
                                                                    fVar62 * *pfVar98))))))));
              pfVar98 = (float *)(lVar122 + lVar104);
              auVar146 = ZEXT3264(CONCAT428(fVar138 + fVar147 + fVar150,
                                            CONCAT424(fVar181 * pfVar24[6] + fVar61 * pfVar14[6] +
                                                      fVar54 * pfVar8[6] + auVar146._24_4_ +
                                                      fVar75 * pfVar98[6],
                                                      CONCAT420(fVar180 * pfVar24[5] +
                                                                fVar60 * pfVar14[5] +
                                                                fVar53 * pfVar8[5] + auVar146._20_4_
                                                                + fVar74 * pfVar98[5],
                                                                CONCAT416(fVar179 * pfVar24[4] +
                                                                          fVar59 * pfVar14[4] +
                                                                          fVar52 * pfVar8[4] +
                                                                          auVar146._16_4_ +
                                                                          fVar73 * pfVar98[4],
                                                                          CONCAT412(fVar178 * 
                                                  pfVar24[3] + fVar58 * pfVar14[3] +
                                                  fVar51 * pfVar8[3] + auVar146._12_4_ +
                                                  fVar72 * pfVar98[3],
                                                  CONCAT48(fVar177 * pfVar24[2] +
                                                           fVar57 * pfVar14[2] +
                                                           fVar50 * pfVar8[2] + auVar146._8_4_ +
                                                           fVar71 * pfVar98[2],
                                                           CONCAT44(fVar176 * pfVar24[1] +
                                                                    fVar56 * pfVar14[1] +
                                                                    fVar49 * pfVar8[1] +
                                                                    auVar146._4_4_ +
                                                                    fVar70 * pfVar98[1],
                                                                    fVar175 * *pfVar24 +
                                                                    fVar55 * *pfVar14 +
                                                                    fVar48 * *pfVar8 +
                                                                    auVar146._0_4_ +
                                                                    fVar69 * *pfVar98))))))));
              pfVar98 = (float *)(lVar122 + -0x20 + lVar114);
              fVar138 = fVar138 + fVar137;
              auVar141 = ZEXT3264(CONCAT428(fVar182 + fVar138,
                                            CONCAT424(fVar82 * pfVar16[6] + fVar40 * pfVar4[6] +
                                                      fVar68 * pfVar98[6] +
                                                      fVar47 * pfVar23[6] + auVar141._24_4_,
                                                      CONCAT420(fVar81 * pfVar16[5] +
                                                                fVar39 * pfVar4[5] +
                                                                fVar67 * pfVar98[5] +
                                                                fVar46 * pfVar23[5] +
                                                                auVar141._20_4_,
                                                                CONCAT416(fVar80 * pfVar16[4] +
                                                                          fVar38 * pfVar4[4] +
                                                                          fVar66 * pfVar98[4] +
                                                                          fVar45 * pfVar23[4] +
                                                                          auVar141._16_4_,
                                                                          CONCAT412(fVar79 * pfVar16
                                                  [3] + fVar37 * pfVar4[3] +
                                                  fVar65 * pfVar98[3] +
                                                  fVar44 * pfVar23[3] + auVar141._12_4_,
                                                  CONCAT48(fVar78 * pfVar16[2] + fVar36 * pfVar4[2]
                                                           + fVar64 * pfVar98[2] +
                                                             fVar43 * pfVar23[2] + auVar141._8_4_,
                                                           CONCAT44(fVar77 * pfVar16[1] +
                                                                    fVar35 * pfVar4[1] +
                                                                    fVar63 * pfVar98[1] +
                                                                    fVar42 * pfVar23[1] +
                                                                    auVar141._4_4_,
                                                                    fVar76 * *pfVar16 +
                                                                    fVar34 * *pfVar4 +
                                                                    fVar62 * *pfVar98 +
                                                                    fVar41 * *pfVar23 +
                                                                    auVar141._0_4_))))))));
              pfVar98 = (float *)(lVar122 + lVar114);
              fVar138 = fVar191 + fVar138;
              fVar184 = fVar175 * *pfVar15 + fVar55 * *pfVar5 +
                        fVar184 + fVar48 * *pfVar9 + fVar69 * *pfVar98;
              fVar185 = fVar176 * pfVar15[1] + fVar56 * pfVar5[1] +
                        fVar185 + fVar49 * pfVar9[1] + fVar70 * pfVar98[1];
              fVar186 = fVar177 * pfVar15[2] + fVar57 * pfVar5[2] +
                        fVar186 + fVar50 * pfVar9[2] + fVar71 * pfVar98[2];
              fVar187 = fVar178 * pfVar15[3] + fVar58 * pfVar5[3] +
                        fVar187 + fVar51 * pfVar9[3] + fVar72 * pfVar98[3];
              fVar188 = fVar179 * pfVar15[4] + fVar59 * pfVar5[4] +
                        fVar188 + fVar52 * pfVar9[4] + fVar73 * pfVar98[4];
              fVar189 = fVar180 * pfVar15[5] + fVar60 * pfVar5[5] +
                        fVar189 + fVar53 * pfVar9[5] + fVar74 * pfVar98[5];
              fVar190 = fVar181 * pfVar15[6] + fVar61 * pfVar5[6] +
                        fVar190 + fVar54 * pfVar9[6] + fVar75 * pfVar98[6];
              fVar191 = fVar174 + fVar138;
              pfVar98 = (float *)(lVar119 + 0xc0 + lVar1);
              pfVar4 = (float *)(lVar119 + 0xe0 + lVar1);
              fVar167 = fVar34 * *pfVar2 + fVar167 + fVar41 * *pfVar17 + fVar76 * *pfVar25 +
                        fVar62 * *pfVar98;
              fVar168 = fVar35 * pfVar2[1] + fVar168 + fVar42 * pfVar17[1] + fVar77 * pfVar25[1] +
                        fVar63 * pfVar98[1];
              fVar169 = fVar36 * pfVar2[2] + fVar169 + fVar43 * pfVar17[2] + fVar78 * pfVar25[2] +
                        fVar64 * pfVar98[2];
              fVar170 = fVar37 * pfVar2[3] + fVar170 + fVar44 * pfVar17[3] + fVar79 * pfVar25[3] +
                        fVar65 * pfVar98[3];
              fVar171 = fVar38 * pfVar2[4] + fVar171 + fVar45 * pfVar17[4] + fVar80 * pfVar25[4] +
                        fVar66 * pfVar98[4];
              fVar172 = fVar39 * pfVar2[5] + fVar172 + fVar46 * pfVar17[5] + fVar81 * pfVar25[5] +
                        fVar67 * pfVar98[5];
              fVar173 = fVar40 * pfVar2[6] + fVar173 + fVar47 * pfVar17[6] + fVar82 * pfVar25[6] +
                        fVar68 * pfVar98[6];
              fVar154 = fVar154 + fVar165 + fVar138;
              auVar157 = ZEXT3264(CONCAT428(fVar174 + fVar155 + fVar136,
                                            CONCAT424(fVar75 * pfVar4[6] +
                                                      fVar54 * pfVar3[6] + fVar61 * pfVar26[6] +
                                                      fVar181 * pfVar6[6] + auVar157._24_4_,
                                                      CONCAT420(fVar74 * pfVar4[5] +
                                                                fVar53 * pfVar3[5] +
                                                                fVar60 * pfVar26[5] +
                                                                fVar180 * pfVar6[5] +
                                                                auVar157._20_4_,
                                                                CONCAT416(fVar73 * pfVar4[4] +
                                                                          fVar52 * pfVar3[4] +
                                                                          fVar59 * pfVar26[4] +
                                                                          fVar179 * pfVar6[4] +
                                                                          auVar157._16_4_,
                                                                          CONCAT412(fVar72 * pfVar4[
                                                  3] + fVar51 * pfVar3[3] + fVar58 * pfVar26[3] +
                                                       fVar178 * pfVar6[3] + auVar157._12_4_,
                                                  CONCAT48(fVar71 * pfVar4[2] +
                                                           fVar50 * pfVar3[2] + fVar57 * pfVar26[2]
                                                           + fVar177 * pfVar6[2] + auVar157._8_4_,
                                                           CONCAT44(fVar70 * pfVar4[1] +
                                                                    fVar49 * pfVar3[1] +
                                                                    fVar56 * pfVar26[1] +
                                                                    fVar176 * pfVar6[1] +
                                                                    auVar157._4_4_,
                                                                    fVar69 * *pfVar4 +
                                                                    fVar48 * *pfVar3 +
                                                                    fVar55 * *pfVar26 +
                                                                    fVar175 * *pfVar6 +
                                                                    auVar157._0_4_))))))));
              uVar97 = uVar93 + 4;
              auVar118 = (undefined1  [8])((long)auVar118 + local_168 * local_198 * 4);
              lVar122 = lVar122 + lVar111 * 4;
              lVar113 = uVar93 + 7;
              uVar93 = uVar97;
            } while (lVar113 < (int)_c);
          }
          auVar156 = auVar157._0_32_;
          auVar145 = auVar146._0_32_;
          auVar148 = auVar149._0_32_;
          auVar152 = auVar153._0_32_;
          if ((int)uVar97 < (int)_c) {
            uVar97 = uVar97 & 0xffffffff;
            pfVar98 = (float *)(((long)iVar102 * uVar97 + sVar33 * local_268) * sVar32 +
                               (long)pvVar121);
            pauVar106 = (undefined1 (*) [32])
                        ((long)local_1a8 +
                        (local_168 * uVar97 + (long)(int)fStack_17c * uVar109) * local_198 + 0x20);
            lVar122 = uVar108 - uVar97;
            do {
              fVar34 = *(float *)pauVar106[-1];
              fVar35 = *(float *)(pauVar106[-1] + 4);
              fVar36 = *(float *)(pauVar106[-1] + 8);
              fVar37 = *(float *)(pauVar106[-1] + 0xc);
              fVar38 = *(float *)(pauVar106[-1] + 0x10);
              fVar39 = *(float *)(pauVar106[-1] + 0x14);
              fVar40 = *(float *)(pauVar106[-1] + 0x18);
              auVar145 = *pauVar106;
              auVar152._0_4_ = fVar34 * *pfVar98 + auVar153._0_4_;
              auVar152._4_4_ = fVar35 * pfVar98[1] + auVar153._4_4_;
              auVar152._8_4_ = fVar36 * pfVar98[2] + auVar153._8_4_;
              auVar152._12_4_ = fVar37 * pfVar98[3] + auVar153._12_4_;
              auVar152._16_4_ = fVar38 * pfVar98[4] + auVar153._16_4_;
              auVar152._20_4_ = fVar39 * pfVar98[5] + auVar153._20_4_;
              auVar152._24_4_ = fVar40 * pfVar98[6] + auVar153._24_4_;
              auVar152._28_4_ = fVar174 + auVar153._28_4_;
              auVar153 = ZEXT3264(auVar152);
              fVar175 = auVar145._0_4_;
              fVar176 = auVar145._4_4_;
              fVar177 = auVar145._8_4_;
              fVar178 = auVar145._12_4_;
              fVar179 = auVar145._16_4_;
              fVar180 = auVar145._20_4_;
              fVar181 = auVar145._24_4_;
              fVar158 = fVar175 * pfVar98[8] + fVar158;
              fVar159 = fVar176 * pfVar98[9] + fVar159;
              fVar160 = fVar177 * pfVar98[10] + fVar160;
              fVar161 = fVar178 * pfVar98[0xb] + fVar161;
              fVar162 = fVar179 * pfVar98[0xc] + fVar162;
              fVar163 = fVar180 * pfVar98[0xd] + fVar163;
              fVar164 = fVar181 * pfVar98[0xe] + fVar164;
              fVar166 = fVar174 + fVar166;
              pfVar2 = (float *)((long)pfVar98 + lVar119);
              auVar148._0_4_ = fVar34 * *pfVar2 + auVar149._0_4_;
              auVar148._4_4_ = fVar35 * pfVar2[1] + auVar149._4_4_;
              auVar148._8_4_ = fVar36 * pfVar2[2] + auVar149._8_4_;
              auVar148._12_4_ = fVar37 * pfVar2[3] + auVar149._12_4_;
              auVar148._16_4_ = fVar38 * pfVar2[4] + auVar149._16_4_;
              auVar148._20_4_ = fVar39 * pfVar2[5] + auVar149._20_4_;
              auVar148._24_4_ = fVar40 * pfVar2[6] + auVar149._24_4_;
              auVar148._28_4_ = fVar174 + auVar149._28_4_;
              auVar149 = ZEXT3264(auVar148);
              pfVar2 = (float *)((long)pfVar98 + lVar119 + 0x20);
              auVar145._0_4_ = fVar175 * *pfVar2 + auVar146._0_4_;
              auVar145._4_4_ = fVar176 * pfVar2[1] + auVar146._4_4_;
              auVar145._8_4_ = fVar177 * pfVar2[2] + auVar146._8_4_;
              auVar145._12_4_ = fVar178 * pfVar2[3] + auVar146._12_4_;
              auVar145._16_4_ = fVar179 * pfVar2[4] + auVar146._16_4_;
              auVar145._20_4_ = fVar180 * pfVar2[5] + auVar146._20_4_;
              auVar145._24_4_ = fVar181 * pfVar2[6] + auVar146._24_4_;
              auVar145._28_4_ = fVar174 + auVar146._28_4_;
              auVar146 = ZEXT3264(auVar145);
              pfVar2 = (float *)((long)pfVar98 + lVar119 * 2);
              auVar141 = ZEXT3264(CONCAT428(fVar174 + auVar141._28_4_,
                                            CONCAT424(fVar40 * pfVar2[6] + auVar141._24_4_,
                                                      CONCAT420(fVar39 * pfVar2[5] + auVar141._20_4_
                                                                ,CONCAT416(fVar38 * pfVar2[4] +
                                                                           auVar141._16_4_,
                                                                           CONCAT412(fVar37 * pfVar2
                                                  [3] + auVar141._12_4_,
                                                  CONCAT48(fVar36 * pfVar2[2] + auVar141._8_4_,
                                                           CONCAT44(fVar35 * pfVar2[1] +
                                                                    auVar141._4_4_,
                                                                    fVar34 * *pfVar2 +
                                                                    auVar141._0_4_))))))));
              pfVar3 = (float *)((long)pfVar98 + lVar119 * 2 + 0x20);
              pfVar2 = (float *)((long)pfVar98 + lVar119 * 3);
              fVar184 = fVar175 * *pfVar3 + fVar184;
              fVar185 = fVar176 * pfVar3[1] + fVar185;
              fVar186 = fVar177 * pfVar3[2] + fVar186;
              fVar187 = fVar178 * pfVar3[3] + fVar187;
              fVar188 = fVar179 * pfVar3[4] + fVar188;
              fVar189 = fVar180 * pfVar3[5] + fVar189;
              fVar190 = fVar181 * pfVar3[6] + fVar190;
              fVar191 = fVar174 + fVar191;
              fVar167 = fVar34 * *pfVar2 + fVar167;
              fVar168 = fVar35 * pfVar2[1] + fVar168;
              fVar169 = fVar36 * pfVar2[2] + fVar169;
              fVar170 = fVar37 * pfVar2[3] + fVar170;
              fVar171 = fVar38 * pfVar2[4] + fVar171;
              fVar172 = fVar39 * pfVar2[5] + fVar172;
              fVar173 = fVar40 * pfVar2[6] + fVar173;
              fVar154 = *(float *)(pauVar106[-1] + 0x1c) + fVar154;
              pfVar2 = (float *)((long)pfVar98 + lVar119 * 3 + 0x20);
              auVar156._0_4_ = fVar175 * *pfVar2 + auVar157._0_4_;
              auVar156._4_4_ = fVar176 * pfVar2[1] + auVar157._4_4_;
              auVar156._8_4_ = fVar177 * pfVar2[2] + auVar157._8_4_;
              auVar156._12_4_ = fVar178 * pfVar2[3] + auVar157._12_4_;
              auVar156._16_4_ = fVar179 * pfVar2[4] + auVar157._16_4_;
              auVar156._20_4_ = fVar180 * pfVar2[5] + auVar157._20_4_;
              auVar156._24_4_ = fVar181 * pfVar2[6] + auVar157._24_4_;
              auVar156._28_4_ = *(float *)(pauVar106[-1] + 0x1c) + auVar157._28_4_;
              auVar157 = ZEXT3264(auVar156);
              pfVar98 = (float *)((long)pfVar98 + lVar111);
              pauVar106 = (undefined1 (*) [32])(*pauVar106 + local_168 * local_198);
              lVar122 = lVar122 + -1;
            } while (lVar122 != 0);
          }
          lVar122 = (long)local_1f8.w * local_1f8.elemsize * uVar109;
          *(undefined1 (*) [32])((long)(_func_int ***)local_1f8.data + lVar122 + lVar128) = auVar152
          ;
          pfVar98 = (float *)((long)&((Allocator *)((long)local_1f8.data + 0x20))->_vptr_Allocator +
                             lVar122 + lVar128);
          *pfVar98 = fVar158;
          pfVar98[1] = fVar159;
          pfVar98[2] = fVar160;
          pfVar98[3] = fVar161;
          pfVar98[4] = fVar162;
          pfVar98[5] = fVar163;
          pfVar98[6] = fVar164;
          pfVar98[7] = fVar166;
          *(undefined1 (*) [32])((long)(_func_int ***)local_1f8.data + lVar122 + lVar124) = auVar148
          ;
          *(undefined1 (*) [32])
           ((long)&((Allocator *)((long)local_1f8.data + 0x20))->_vptr_Allocator + lVar122 + lVar124
           ) = auVar145;
          *(undefined1 (*) [32])((long)(_func_int ***)local_1f8.data + lVar122 + lVar110) =
               auVar141._0_32_;
          pfVar98 = (float *)((long)&((Allocator *)((long)local_1f8.data + 0x20))->_vptr_Allocator +
                             lVar122 + lVar110);
          *pfVar98 = fVar184;
          pfVar98[1] = fVar185;
          pfVar98[2] = fVar186;
          pfVar98[3] = fVar187;
          pfVar98[4] = fVar188;
          pfVar98[5] = fVar189;
          pfVar98[6] = fVar190;
          pfVar98[7] = fVar191;
          pfVar98 = (float *)((long)(_func_int ***)local_1f8.data + lVar122 + lVar96);
          *pfVar98 = fVar167;
          pfVar98[1] = fVar168;
          pfVar98[2] = fVar169;
          pfVar98[3] = fVar170;
          pfVar98[4] = fVar171;
          pfVar98[5] = fVar172;
          pfVar98[6] = fVar173;
          pfVar98[7] = fVar154;
          *(undefined1 (*) [32])
           ((long)&((Allocator *)((long)local_1f8.data + 0x20))->_vptr_Allocator + lVar122 + lVar96)
               = auVar156;
          uVar109 = uVar109 + 1;
        } while (uVar109 != _h);
      }
      local_2d8 = local_2d8 + 1;
      local_260 = local_260 + 4;
      local_2e8 = local_2e8 + 4;
      local_268 = local_268 + 4;
    } while (local_2d8 != (uint)(_c_00 >> 2));
  }
  auVar134 = auVar141._0_16_;
  if ((int)uVar99 != _c_00) {
    lVar104 = (long)kernel_tm->w;
    local_318 = kernel_tm->data;
    sVar32 = kernel_tm->elemsize;
    lVar124 = kernel_tm->cstep * sVar32;
    local_2f8 = (void *)(lVar124 * uVar99 + (long)local_318);
    lVar96 = sVar32 * lVar104 * 4;
    lVar119 = kernel_tm->cstep * uVar99;
    local_300 = (void *)((lVar119 + lVar104) * sVar32 + (long)local_318);
    local_250 = (void *)((lVar119 + lVar104 * 2) * sVar32 + (long)local_318);
    local_258 = (void *)((lVar104 * 3 + lVar119) * sVar32 + (long)local_318);
    local_2e8 = 0;
    uVar109 = uVar99;
    do {
      if (0 < (int)_h) {
        lVar111 = local_168 * local_198;
        lVar114 = (long)(int)fStack_17c * local_198;
        lVar110 = lVar111 * 4;
        local_e8 = (void *)((long)local_1a8 + lVar111);
        local_310 = (void *)((long)local_1a8 + lVar111 * 2);
        local_320 = (void *)(lVar111 * 3 + (long)local_1a8);
        uVar97 = 0;
        auVar118 = local_1a8;
        do {
          uVar93 = 0;
          sum0[8] = 0.0;
          sum0[9] = 0.0;
          sum0[10] = 0.0;
          sum0[0xb] = 0.0;
          sum0[0xc] = 0.0;
          sum0[0xd] = 0.0;
          sum0[0xe] = 0.0;
          sum0[0xf] = 0.0;
          sum0[0] = 0.0;
          sum0[1] = 0.0;
          sum0[2] = 0.0;
          sum0[3] = 0.0;
          sum0[4] = 0.0;
          sum0[5] = 0.0;
          sum0[6] = 0.0;
          sum0[7] = 0.0;
          if (3 < (int)_c) {
            pvVar121 = local_250;
            pvVar100 = local_e8;
            pvVar101 = local_258;
            pvVar107 = local_2f8;
            pvVar115 = local_300;
            pvVar116 = (void *)auVar118;
            uVar94 = 0;
            pvVar123 = local_320;
            pvVar126 = local_310;
            do {
              lVar125 = 0;
              do {
                pfVar98 = (float *)((long)pvVar107 + lVar125);
                fVar132 = pfVar98[1];
                fVar192 = pfVar98[2];
                fVar193 = pfVar98[3];
                fVar174 = pfVar98[4];
                fVar183 = pfVar98[5];
                fVar194 = pfVar98[6];
                fVar154 = pfVar98[7];
                pfVar2 = (float *)((long)pvVar116 + lVar125);
                fVar158 = pfVar2[1];
                fVar159 = pfVar2[2];
                fVar160 = pfVar2[3];
                fVar161 = pfVar2[4];
                fVar162 = pfVar2[5];
                fVar163 = pfVar2[6];
                pfVar3 = (float *)((long)pvVar115 + lVar125);
                fVar164 = pfVar3[1];
                fVar166 = pfVar3[2];
                fVar167 = pfVar3[3];
                fVar168 = pfVar3[4];
                fVar169 = pfVar3[5];
                fVar170 = pfVar3[6];
                fVar171 = pfVar3[7];
                pfVar4 = (float *)((long)pvVar100 + lVar125);
                fVar172 = pfVar4[1];
                fVar173 = pfVar4[2];
                fVar184 = pfVar4[3];
                fVar185 = pfVar4[4];
                fVar186 = pfVar4[5];
                fVar187 = pfVar4[6];
                pfVar5 = (float *)((long)pvVar121 + lVar125);
                fVar188 = pfVar5[1];
                fVar189 = pfVar5[2];
                fVar190 = pfVar5[3];
                fVar191 = pfVar5[4];
                fVar34 = pfVar5[5];
                fVar35 = pfVar5[6];
                fVar36 = pfVar5[7];
                pfVar6 = (float *)((long)pvVar126 + lVar125);
                fVar37 = pfVar6[1];
                fVar38 = pfVar6[2];
                fVar39 = pfVar6[3];
                fVar40 = pfVar6[4];
                fVar175 = pfVar6[5];
                fVar176 = pfVar6[6];
                pfVar7 = (float *)((long)pvVar101 + lVar125);
                fVar177 = pfVar7[1];
                fVar178 = pfVar7[2];
                fVar179 = pfVar7[3];
                fVar180 = pfVar7[4];
                fVar181 = pfVar7[5];
                fVar41 = pfVar7[6];
                fVar42 = pfVar7[7];
                pfVar8 = (float *)((long)pvVar123 + lVar125);
                fVar43 = pfVar8[1];
                fVar44 = pfVar8[2];
                fVar45 = pfVar8[3];
                fVar46 = pfVar8[4];
                fVar47 = pfVar8[5];
                fVar48 = pfVar8[6];
                *(float *)((long)sum0 + lVar125) =
                     *pfVar7 * *pfVar8 +
                     *pfVar5 * *pfVar6 + *pfVar3 * *pfVar4 +
                     *pfVar98 * *pfVar2 + *(float *)((long)sum0 + lVar125);
                *(float *)((long)sum0 + lVar125 + 4) =
                     fVar177 * fVar43 +
                     fVar188 * fVar37 + fVar164 * fVar172 +
                     fVar132 * fVar158 + *(float *)((long)sum0 + lVar125 + 4);
                *(float *)((long)sum0 + lVar125 + 8) =
                     fVar178 * fVar44 +
                     fVar189 * fVar38 + fVar166 * fVar173 +
                     fVar192 * fVar159 + *(float *)((long)sum0 + lVar125 + 8);
                *(float *)((long)sum0 + lVar125 + 0xc) =
                     fVar179 * fVar45 +
                     fVar190 * fVar39 + fVar167 * fVar184 +
                     fVar193 * fVar160 + *(float *)((long)sum0 + lVar125 + 0xc);
                *(float *)((long)sum0 + lVar125 + 0x10) =
                     fVar180 * fVar46 +
                     fVar191 * fVar40 + fVar168 * fVar185 +
                     fVar174 * fVar161 + *(float *)((long)sum0 + lVar125 + 0x10);
                *(float *)((long)sum0 + lVar125 + 0x14) =
                     fVar181 * fVar47 +
                     fVar34 * fVar175 + fVar169 * fVar186 +
                     fVar183 * fVar162 + *(float *)((long)sum0 + lVar125 + 0x14);
                *(float *)((long)sum0 + lVar125 + 0x18) =
                     fVar41 * fVar48 +
                     fVar35 * fVar176 + fVar170 * fVar187 +
                     fVar194 * fVar163 + *(float *)((long)sum0 + lVar125 + 0x18);
                *(float *)((long)sum0 + lVar125 + 0x1c) =
                     fVar42 + fVar36 + fVar171 + fVar154 + *(float *)((long)sum0 + lVar125 + 0x1c);
                lVar125 = lVar125 + 0x20;
              } while (lVar125 != 0x40);
              uVar93 = uVar94 + 4;
              lVar125 = uVar94 + 7;
              pvVar116 = (void *)((long)pvVar116 + lVar110);
              pvVar107 = (void *)((long)pvVar107 + lVar96);
              pvVar100 = (void *)((long)pvVar100 + lVar110);
              pvVar115 = (void *)((long)pvVar115 + lVar96);
              pvVar126 = (void *)((long)pvVar126 + lVar110);
              pvVar121 = (void *)((long)pvVar121 + lVar96);
              pvVar123 = (void *)((long)pvVar123 + lVar110);
              pvVar101 = (void *)((long)pvVar101 + lVar96);
              uVar94 = uVar93;
            } while (lVar125 < (int)_c);
          }
          if ((int)uVar93 < (int)_c) {
            uVar93 = uVar93 & 0xffffffff;
            pvVar121 = (void *)(lVar111 * uVar93 + (long)auVar118);
            pvVar100 = (void *)((lVar104 * uVar93 + lVar119) * sVar32 + (long)local_318);
            do {
              lVar125 = 0;
              do {
                pfVar98 = (float *)((long)pvVar100 + lVar125 * 4);
                fVar132 = pfVar98[1];
                fVar192 = pfVar98[2];
                fVar193 = pfVar98[3];
                fVar174 = pfVar98[4];
                fVar183 = pfVar98[5];
                fVar194 = pfVar98[6];
                fVar154 = pfVar98[7];
                pfVar2 = (float *)((long)pvVar121 + lVar125 * 4);
                fVar158 = pfVar2[1];
                fVar159 = pfVar2[2];
                fVar160 = pfVar2[3];
                fVar161 = pfVar2[4];
                fVar162 = pfVar2[5];
                fVar163 = pfVar2[6];
                sum0[lVar125] = *pfVar98 * *pfVar2 + sum0[lVar125];
                sum0[lVar125 + 1] = fVar132 * fVar158 + sum0[lVar125 + 1];
                sum0[lVar125 + 2] = fVar192 * fVar159 + sum0[lVar125 + 2];
                sum0[lVar125 + 3] = fVar193 * fVar160 + sum0[lVar125 + 3];
                sum0[lVar125 + 4] = fVar174 * fVar161 + sum0[lVar125 + 4];
                sum0[lVar125 + 5] = fVar183 * fVar162 + sum0[lVar125 + 5];
                sum0[lVar125 + 6] = fVar194 * fVar163 + sum0[lVar125 + 6];
                sum0[lVar125 + 7] = fVar154 + sum0[lVar125 + 7];
                lVar125 = lVar125 + 8;
              } while (lVar125 != 0x10);
              uVar93 = uVar93 + 1;
              pvVar121 = (void *)((long)pvVar121 + lVar111);
              pvVar100 = (void *)((long)pvVar100 + sVar32 * lVar104);
            } while (uVar93 != uVar108);
          }
          pauVar106 = (undefined1 (*) [32])
                      ((long)(_func_int ***)local_1f8.data +
                      (long)local_1f8.w * local_1f8.elemsize * uVar97 +
                      (local_2e8 + uVar99) * local_1f8.cstep * local_1f8.elemsize);
          auVar87._8_4_ = sum0[2];
          auVar87._0_4_ = sum0[0];
          auVar87._4_4_ = sum0[1];
          auVar87._12_4_ = sum0[3];
          auVar87._16_4_ = sum0[4];
          auVar87._20_4_ = sum0[5];
          auVar87._24_4_ = sum0[6];
          auVar87._28_4_ = sum0[7];
          auVar141 = ZEXT3264(auVar87);
          auVar88._8_4_ = sum0[10];
          auVar88._0_4_ = sum0[8];
          auVar88._4_4_ = sum0[9];
          auVar88._12_4_ = sum0[0xb];
          auVar88._16_4_ = sum0[0xc];
          auVar88._20_4_ = sum0[0xd];
          auVar88._24_4_ = sum0[0xe];
          auVar88._28_4_ = sum0[0xf];
          pauVar106[1] = auVar88;
          *pauVar106 = auVar87;
          uVar97 = uVar97 + 1;
          auVar118 = (undefined1  [8])((long)auVar118 + lVar114);
          local_e8 = (void *)((long)local_e8 + lVar114);
          local_310 = (void *)((long)local_310 + lVar114);
          local_320 = (void *)((long)local_320 + lVar114);
        } while (uVar97 != _h);
      }
      auVar134 = auVar141._0_16_;
      uVar109 = uVar109 + 1;
      local_2e8 = local_2e8 + 1;
      local_2f8 = (void *)((long)local_2f8 + lVar124);
      local_300 = (void *)((long)local_300 + lVar124);
      local_250 = (void *)((long)local_250 + lVar124);
      local_258 = (void *)((long)local_258 + lVar124);
      local_318 = (void *)((long)local_318 + lVar124);
    } while ((long)uVar109 < (long)uVar91);
  }
  sum0[0] = 0.0;
  sum0[1] = 0.0;
  sum0[2] = 0.0;
  sum0[3] = 0.0;
  sum0[4] = 0.0;
  sum0[5] = 0.0;
  sum0[6] = 0.0;
  sum0[8] = 0.0;
  sum0[9] = 0.0;
  sum0[10] = 0.0;
  sum0[0xb] = 0.0;
  sum0[0xc] = 0.0;
  sum0[0xd] = 0.0;
  sum0[0xe] = 0.0;
  piVar30 = (int *)CONCAT44(fStack_19c,uStack_1a0);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_188 == (Allocator *)0x0) {
        if (local_1a8 != (undefined1  [8])0x0) {
          free((void *)local_1a8);
        }
      }
      else {
        (*local_188->_vptr_Allocator[3])();
      }
    }
  }
  piVar30 = (int *)CONCAT44(sum0[3],sum0[2]);
  local_1a8._0_4_ = sum0[0];
  local_1a8._4_4_ = sum0[1];
  uStack_1a0 = sum0[2];
  fStack_19c = sum0[3];
  local_198 = CONCAT44(sum0[5],sum0[4]);
  local_190 = sum0[6];
  local_188 = (Allocator *)sum0._32_8_;
  uStack_178._4_4_ = (int)sum0[0xd];
  uStack_178._0_4_ = (int)sum0[0xc];
  fStack_180 = sum0[10];
  fStack_17c = sum0[0xb];
  local_170 = sum0[0xe];
  local_168 = 0;
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (sum0._32_8_ == 0) {
        if (sum0._0_8_ != 0) {
          free((void *)sum0._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)sum0._32_8_ + 0x18))();
        auVar141._8_56_ = extraout_var;
        auVar141._0_8_ = extraout_XMM1_Qa;
        auVar134 = auVar141._0_16_;
      }
    }
  }
  local_288 = 0;
  sum0[0] = 0.0;
  sum0[1] = 0.0;
  sum0[2] = 0.0;
  sum0[3] = 0.0;
  sum0[4] = 0.0;
  sum0[5] = 0.0;
  sum0[6] = 0.0;
  sum0[8] = 0.0;
  sum0[9] = 0.0;
  sum0[10] = 0.0;
  sum0[0xb] = 0.0;
  sum0[0xc] = 0.0;
  sum0[0xd] = 0.0;
  sum0[0xe] = 0.0;
  uVar27 = dst->w;
  uVar29 = dst->h;
  auVar135._4_4_ = uVar29;
  auVar135._0_4_ = uVar27;
  auVar135._8_8_ = 0;
  auVar133 = vpcmpeqd_avx(auVar135,auVar139);
  auVar133 = vpmovsxdq_avx(auVar133);
  auVar134 = vpcmpeqd_avx(auVar134,auVar134);
  if (((auVar134 & ~auVar133) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar134 & ~auVar133,0xf)) {
    if ((Mat *)sum0 != dst) {
      piVar30 = dst->refcount;
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + 1;
        UNLOCK();
      }
      sum0._0_8_ = dst->data;
      sum0[2] = SUB84(dst->refcount,0);
      sum0[3] = (float)((ulong)dst->refcount >> 0x20);
      sum0[4] = (float)dst->elemsize;
      sum0[5] = (float)(dst->elemsize >> 0x20);
      sum0[6] = (float)dst->elempack;
      sum0._32_8_ = dst->allocator;
      uVar83 = dst->dims;
      uVar84 = dst->w;
      uVar85 = dst->h;
      uVar86 = dst->d;
      sum0[0xe] = (float)dst->c;
      local_288 = dst->cstep;
      sum0[10] = (float)uVar83;
      sum0[0xb] = (float)uVar84;
      sum0[0xc] = (float)uVar85;
      sum0[0xd] = (float)uVar86;
    }
  }
  else {
    Mat::create((Mat *)sum0,(int)local_108,auVar139._4_4_,_c_00,4,opt->workspace_allocator);
  }
  if (0 < _c_00) {
    uVar108 = 1;
    if (1 < (int)uVar131) {
      uVar108 = (ulong)uVar131;
    }
    uVar99 = 1;
    if (1 < (int)uVar95) {
      uVar99 = (ulong)uVar95;
    }
    lVar104 = local_288 * CONCAT44(sum0[5],sum0[4]);
    lVar96 = CONCAT44(sum0[5],sum0[4]) * (long)(int)sum0[0xb];
    local_e8 = (void *)sum0._0_8_;
    local_2f0 = sum0._0_8_ + lVar96;
    lVar96 = lVar96 * 2;
    lVar119 = 0;
    uVar109 = 0;
    do {
      if (pvVar31 == (void *)0x0) {
        fVar132 = 0.0;
      }
      else {
        fVar132 = *(float *)((long)pvVar31 + uVar109 * 4);
      }
      if (0 < (int)uVar28._4_4_) {
        uVar97 = 0;
        uVar93 = 0;
        pvVar121 = local_e8;
        lVar124 = local_2f0;
        do {
          if (0 < (int)(undefined4)uVar28) {
            ppp_Var130 = (_func_int ***)
                         ((long)&((Allocator *)((long)local_1f8.data + 0x30))->_vptr_Allocator +
                         (uVar97 * (long)local_1f8.w + lVar119) * local_1f8.elemsize);
            uVar94 = 0;
            do {
              auVar134 = *(undefined1 (*) [16])(ppp_Var130 + -4);
              auVar139 = *(undefined1 (*) [16])(ppp_Var130 + -2);
              auVar133 = vsubps_avx(auVar134,auVar139);
              auVar140._0_4_ = auVar133._0_4_ + *(float *)ppp_Var130;
              auVar140._4_4_ = auVar133._4_4_ + *(float *)((long)ppp_Var130 + 4);
              auVar140._8_4_ = auVar133._8_4_ + *(float *)(ppp_Var130 + 1);
              auVar140._12_4_ = auVar133._12_4_ + *(float *)((long)(ppp_Var130 + 1) + 4);
              auVar144._0_4_ = auVar134._0_4_ + *(float *)(ppp_Var130 + -6) + auVar139._0_4_;
              auVar144._4_4_ =
                   auVar134._4_4_ + *(float *)((long)(ppp_Var130 + -6) + 4) + auVar139._4_4_;
              auVar144._8_4_ = auVar134._8_4_ + *(float *)(ppp_Var130 + -5) + auVar139._8_4_;
              auVar144._12_4_ =
                   auVar134._12_4_ + *(float *)((long)(ppp_Var130 + -5) + 4) + auVar139._12_4_;
              auVar134 = vmovshdup_avx(auVar144);
              auVar139 = vmovshdup_avx(auVar140);
              auVar133 = vshufpd_avx(auVar144,auVar144,1);
              auVar135 = vshufpd_avx(auVar140,auVar140,1);
              auVar151 = vshufps_avx(auVar144,auVar144,0xff);
              auVar143 = vshufps_avx(auVar140,auVar140,0xff);
              o1[0] = ((auVar134._0_4_ + fVar132) - auVar133._0_4_) + auVar151._0_4_;
              o1[1] = auVar143._0_4_ + ((auVar139._0_4_ + fVar132) - auVar135._0_4_);
              *(ulong *)((long)pvVar121 + uVar94 * 8) =
                   CONCAT44(auVar140._0_4_ + fVar132 + auVar139._0_4_ + auVar135._0_4_,
                            auVar134._0_4_ + auVar133._0_4_ + auVar144._0_4_ + fVar132);
              *(ulong *)(lVar124 + uVar94 * 8) = CONCAT44(o1[1],o1[0]);
              uVar94 = uVar94 + 1;
              ppp_Var130 = (_func_int ***)
                           ((long)ppp_Var130 + local_1f8.elemsize * (long)local_1f8.w);
            } while (uVar108 != uVar94);
          }
          uVar93 = uVar93 + 1;
          uVar97 = (ulong)((int)uVar97 + uVar131);
          lVar124 = lVar124 + lVar96;
          pvVar121 = (void *)((long)pvVar121 + lVar96);
        } while (uVar93 != uVar99);
      }
      uVar109 = uVar109 + 1;
      lVar119 = lVar119 + local_1f8.cstep;
      local_2f0 = local_2f0 + lVar104;
      local_e8 = (void *)((long)local_e8 + lVar104);
      dst = local_100;
    } while (uVar109 != uVar91);
  }
  copy_cut_border((Mat *)sum0,dst,0,(int)sum0[0xc] - dst->h,0,(int)sum0[0xb] - dst->w,opt);
  piVar30 = (int *)CONCAT44(sum0[3],sum0[2]);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (sum0._32_8_ == 0) {
        if (sum0._0_8_ != 0) {
          free((void *)sum0._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)sum0._32_8_ + 0x18))();
      }
    }
  }
  piVar30 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1f8.data != (Allocator *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar30 = (int *)CONCAT44(fStack_19c,uStack_1a0);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_188 == (Allocator *)0x0) {
        if (local_1a8 != (undefined1  [8])0x0) {
          free((void *)local_1a8);
        }
      }
      else {
        (*local_188->_vptr_Allocator[3])();
      }
    }
  }
  if ((int *)local_158._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_158._8_8_ == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((void *)local_158._0_8_ != (void *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    const float* bias = _bias;

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 4u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const float* img = bottom_blob_bordered.channel(q);
            float* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const float* r0 = img + w * j * 2;
                const float* r1 = r0 + w;
                const float* r2 = r1 + w;
                const float* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
#if __AVX__
                    __m128 _d0, _d1, _d2, _d3;
                    __m128 _w0, _w1, _w2, _w3;

                    // load
                    _d0 = _mm_loadu_ps(r0);
                    _d1 = _mm_loadu_ps(r1);
                    _d2 = _mm_loadu_ps(r2);
                    _d3 = _mm_loadu_ps(r3);

                    // w = B_t * d
                    _w0 = _mm_sub_ps(_d0, _d2);
                    _w1 = _mm_add_ps(_d1, _d2);
                    _w2 = _mm_sub_ps(_d2, _d1);
                    _w3 = _mm_sub_ps(_d3, _d1);

                    // transpose d to d_t
                    _MM_TRANSPOSE4_PS(_w0, _w1, _w2, _w3);

                    // d = B_t * d_t
                    _d0 = _mm_sub_ps(_w0, _w2);
                    _d1 = _mm_add_ps(_w1, _w2);
                    _d2 = _mm_sub_ps(_w2, _w1);
                    _d3 = _mm_sub_ps(_w3, _w1);

                    // save to out_tm
                    _mm_storeu_ps(out_tm0, _d0);
                    _mm_storeu_ps(out_tm0 + 4, _d1);
                    _mm_storeu_ps(out_tm0 + 8, _d2);
                    _mm_storeu_ps(out_tm0 + 12, _d3);
#else
                    float d0[4], d1[4], d2[4], d3[4];
                    float w0[4], w1[4], w2[4], w3[4];
                    float t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // d = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }
#endif
                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);
                float* output1_tm = out1_tm.row(i);
                float* output2_tm = out2_tm.row(i);
                float* output3_tm = out3_tm.row(i);

#if __AVX__
                float zero_val = 0.f;

                __m256 _sum0 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum0n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum1 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum1n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum2 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum2n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum3 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum3n = _mm256_broadcast_ss(&zero_val);

                int q = 0;

                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    __m256 _r0 = _mm256_loadu_ps(r0);
                    __m256 _r0n = _mm256_loadu_ps(r0 + 8);
                    // k0
                    __m256 _k0 = _mm256_loadu_ps(k0);
                    __m256 _k0n = _mm256_loadu_ps(k0 + 8);
                    __m256 _k1 = _mm256_loadu_ps(k1);
                    __m256 _k1n = _mm256_loadu_ps(k1 + 8);
                    __m256 _k2 = _mm256_loadu_ps(k2);
                    __m256 _k2n = _mm256_loadu_ps(k2 + 8);
                    __m256 _k3 = _mm256_loadu_ps(k3);
                    __m256 _k3n = _mm256_loadu_ps(k3 + 8);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);

                    // k1
                    _r0 = _mm256_loadu_ps(r1);
                    _r0n = _mm256_loadu_ps(r1 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 16);
                    _k0n = _mm256_loadu_ps(k0 + 24);
                    _k1 = _mm256_loadu_ps(k1 + 16);
                    _k1n = _mm256_loadu_ps(k1 + 24);
                    _k2 = _mm256_loadu_ps(k2 + 16);
                    _k2n = _mm256_loadu_ps(k2 + 24);
                    _k3 = _mm256_loadu_ps(k3 + 16);
                    _k3n = _mm256_loadu_ps(k3 + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                    // k2
                    _r0 = _mm256_loadu_ps(r2);
                    _r0n = _mm256_loadu_ps(r2 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 32);
                    _k0n = _mm256_loadu_ps(k0 + 40);
                    _k1 = _mm256_loadu_ps(k1 + 32);
                    _k1n = _mm256_loadu_ps(k1 + 40);
                    _k2 = _mm256_loadu_ps(k2 + 32);
                    _k2n = _mm256_loadu_ps(k2 + 40);
                    _k3 = _mm256_loadu_ps(k3 + 32);
                    _k3n = _mm256_loadu_ps(k3 + 40);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                    // k3
                    _r0 = _mm256_loadu_ps(r3);
                    _r0n = _mm256_loadu_ps(r3 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 48);
                    _k0n = _mm256_loadu_ps(k0 + 56);
                    _k1 = _mm256_loadu_ps(k1 + 48);
                    _k1n = _mm256_loadu_ps(k1 + 56);
                    _k2 = _mm256_loadu_ps(k2 + 48);
                    _k2n = _mm256_loadu_ps(k2 + 56);
                    _k3 = _mm256_loadu_ps(k3 + 48);
                    _k3n = _mm256_loadu_ps(k3 + 56);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    __m256 _r0 = _mm256_loadu_ps(r0);
                    __m256 _r0n = _mm256_loadu_ps(r0 + 8);
                    __m256 _k0 = _mm256_loadu_ps(k0);
                    __m256 _k0n = _mm256_loadu_ps(k0 + 8);
                    __m256 _k1 = _mm256_loadu_ps(k1);
                    __m256 _k1n = _mm256_loadu_ps(k1 + 8);
                    __m256 _k2 = _mm256_loadu_ps(k2);
                    __m256 _k2n = _mm256_loadu_ps(k2 + 8);
                    __m256 _k3 = _mm256_loadu_ps(k3);
                    __m256 _k3n = _mm256_loadu_ps(k3 + 8);

                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                }

                _mm256_storeu_ps(output0_tm, _sum0);
                _mm256_storeu_ps(output0_tm + 8, _sum0n);
                _mm256_storeu_ps(output1_tm, _sum1);
                _mm256_storeu_ps(output1_tm + 8, _sum1n);
                _mm256_storeu_ps(output2_tm, _sum2);
                _mm256_storeu_ps(output2_tm + 8, _sum2n);
                _mm256_storeu_ps(output3_tm, _sum3);
                _mm256_storeu_ps(output3_tm + 8, _sum3n);
#else
                float sum0[16] = {0.0f};
                float sum1[16] = {0.0f};
                float sum2[16] = {0.0f};
                float sum3[16] = {0.0f};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        sum1[n] += r0[n] * k1[n];
                        sum2[n] += r0[n] * k2[n];
                        sum3[n] += r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
#endif
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);

                float sum0[16] = {0.0f};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel0_tm.row(q + 1);
                    const float* k2 = kernel0_tm.row(q + 2);
                    const float* k3 = kernel0_tm.row(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        sum0[n] += r1[n] * k1[n];
                        sum0[n] += r2[n] * k2[n];
                        sum0[n] += r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* k0 = kernel0_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            const float bias0 = bias ? bias[p] : 0.f;

            for (int j = 0; j < nColBlocks; j++)
            {
                float* outRow0 = out.row(j * 2);
                float* outRow1 = out.row(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    float* out_tile = out_tm.row(j * nRowBlocks + i);

                    float s0[4], s1[4], s2[4], s3[4];
                    float w0[4], w1[4];
                    float d0[2], d1[2], d2[2], d3[2];
                    float o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] + bias0;
                        o1[n] = d1[n] - d2[n] + d3[n] + bias0;
                    }
                    // save to top blob tm
                    outRow0[0] = o0[0];
                    outRow0[1] = o0[1];
                    outRow1[0] = o1[0];
                    outRow1[1] = o1[1];

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}